

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O0

void __thiscall
t_lua_generator::generate_service_processor(t_lua_generator *this,ostream *out,t_service *tservice)

{
  undefined8 tservice_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar4;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_228;
  t_function **local_220;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_218;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  t_service *local_48;
  t_service *extends_s;
  string classname;
  t_service *tservice_local;
  ostream *out_local;
  t_lua_generator *this_local;
  
  classname.field_2._8_8_ = tservice;
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extends_s,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar2),"Processor");
  local_48 = t_service::get_extends((t_service *)classname.field_2._8_8_);
  poVar3 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&extends_s);
  std::operator<<(poVar3," = __TObject.new(");
  if (local_48 == (t_service *)0x0) {
    poVar3 = std::operator<<(out,"__TProcessor");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  else {
    iVar2 = (*(local_48->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar3 = std::operator<<(out,(string *)CONCAT44(extraout_var_00,iVar2));
    poVar3 = std::operator<<(poVar3,"Processor");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  poVar3 = std::operator<<(out,", {");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," __type = \'");
  poVar3 = std::operator<<(poVar3,(string *)&extends_s);
  poVar3 = std::operator<<(poVar3,"\'");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"})");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"function ");
  poVar3 = std::operator<<(poVar3,(string *)&extends_s);
  poVar3 = std::operator<<(poVar3,":process(iprot, oprot, server_ctx)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"local name, mtype, seqid = iprot:readMessageBegin()");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"local func_name = \'process_\' .. name");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,
                           "if not self[func_name] or ttype(self[func_name]) ~= \'function\' then");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar3,"if oprot ~= nil then");
  t_generator::indent_up((t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_78);
  poVar3 = std::operator<<(poVar3,"iprot:skip(TType.STRUCT)");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_98);
  poVar3 = std::operator<<(poVar3,"iprot:readMessageEnd()");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_b8);
  poVar3 = std::operator<<(poVar3,"x = TApplicationException:new{");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_d8);
  poVar3 = std::operator<<(poVar3,"  errorCode = TApplicationException.UNKNOWN_METHOD");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_f8);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_118);
  poVar3 = std::operator<<(poVar3,"oprot:writeMessageBegin(name, TMessageType.EXCEPTION, ");
  poVar3 = std::operator<<(poVar3,"seqid)");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_138);
  poVar3 = std::operator<<(poVar3,"x:write(oprot)");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_158);
  poVar3 = std::operator<<(poVar3,"oprot:writeMessageEnd()");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"oprot.trans:flush()");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_198);
  poVar3 = std::operator<<(poVar3,"end");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1b8);
  poVar3 = std::operator<<(poVar3,"return false, \'Unknown function \'..name");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  t_generator::indent_down((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"else");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1d8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
  poVar3 = std::operator<<(poVar3,"  return self[func_name](self, seqid, iprot, oprot, server_ctx)")
  ;
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)
                                  &functions.
                                   super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar3 = std::operator<<(poVar3,"end");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_1d8);
  t_generator::indent_down((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"end");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  __x = t_service::get_functions((t_service *)classname.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_218);
  local_220 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_218._M_current = local_220;
  while( true ) {
    local_228._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=(&local_218,&local_228);
    tservice_00 = classname.field_2._8_8_;
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_218);
    generate_process_function(this,out,(t_service *)tservice_00,*pptVar4);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_218);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string((string *)&extends_s);
  return;
}

Assistant:

void t_lua_generator::generate_service_processor(ostream& out, t_service* tservice) {
  string classname = tservice->get_name() + "Processor";
  t_service* extends_s = tservice->get_extends();

  // Define processor table
  out << endl << classname << " = __TObject.new(";
  if (extends_s != nullptr) {
    out << extends_s->get_name() << "Processor" << endl;
  } else {
    out << "__TProcessor" << endl;
  }
  out << ", {" << endl << " __type = '" << classname << "'" << endl << "})" << endl;

  // Process function
  indent(out) << endl << "function " << classname << ":process(iprot, oprot, server_ctx)" << endl;
  indent_up();

  indent(out) << "local name, mtype, seqid = iprot:readMessageBegin()" << endl;
  indent(out) << "local func_name = 'process_' .. name" << endl;
  indent(out) << "if not self[func_name] or ttype(self[func_name]) ~= 'function' then" << endl;
  indent_up();
  indent(out) << "if oprot ~= nil then";
  indent_up();
  out << endl << indent() << "iprot:skip(TType.STRUCT)" << endl << indent()
      << "iprot:readMessageEnd()" << endl << indent() << "x = TApplicationException:new{" << endl
      << indent() << "  errorCode = TApplicationException.UNKNOWN_METHOD" << endl << indent() << "}"
      << endl << indent() << "oprot:writeMessageBegin(name, TMessageType.EXCEPTION, "
      << "seqid)" << endl << indent() << "x:write(oprot)" << endl << indent()
      << "oprot:writeMessageEnd()" << endl << indent() << "oprot.trans:flush()" << endl;
  indent_down();
  out << indent() << "end" << endl << indent()
      << "return false, 'Unknown function '..name" << endl;
  indent_down();
  indent(out) << "else" << endl << indent()
              << "  return self[func_name](self, seqid, iprot, oprot, server_ctx)" << endl << indent()
              << "end" << endl;

  indent_down();
  indent(out) << "end" << endl;

  // Generate the process subfunctions
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_process_function(out, tservice, *f_iter);
  }
}